

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.cpp
# Opt level: O0

void __thiscall DIS::DataStream::DoRead(DataStream *this,char *ch,size_t bufsize)

{
  reference pvVar1;
  uint local_24;
  uint i;
  size_t bufsize_local;
  char *ch_local;
  DataStream *this_local;
  
  for (local_24 = 0; local_24 < bufsize; local_24 = local_24 + 1) {
    pvVar1 = std::vector<char,_std::allocator<char>_>::at
                       (&this->_buffer,this->_read_pos + (ulong)local_24);
    ch[local_24] = *pvVar1;
  }
  return;
}

Assistant:

void DataStream::DoRead(char* ch, size_t bufsize)
{
   for(unsigned int i=0; i<bufsize; i++)
   {
      ch[i] = _buffer.at(_read_pos+i);
   }
}